

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O0

void __thiscall
slang::ast::CallExpression::visitExprs<slang::ast::ExpressionVarVisitor&>
          (CallExpression *this,ExpressionVarVisitor *visitor)

{
  bool bVar1;
  Expression *pEVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  char *pcVar4;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar5;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar6;
  iterator ppEVar7;
  int __c;
  int __c_00;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_38;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Constraint *constraints;
  Expression *iterExpr;
  variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
  *extra;
  ExpressionVarVisitor *visitor_local;
  CallExpression *this_local;
  
  extra = (variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
           *)visitor;
  visitor_local = (ExpressionVarVisitor *)this;
  pEVar2 = thisClass(this);
  if (pEVar2 != (Expression *)0x0) {
    pEVar2 = thisClass(this);
    visitor = (ExpressionVarVisitor *)extra;
    Expression::visit<slang::ast::ExpressionVarVisitor&>(pEVar2,(ExpressionVarVisitor *)extra);
  }
  bVar1 = isSystemCall(this);
  if (bVar1) {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    iterExpr = (Expression *)&pvVar3->extraInfo;
    pcVar4 = std::
             variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             ::index((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                      *)iterExpr,&visitor->anyVars,__c);
    if (pcVar4 == (char *)0x1) {
      pvVar5 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                           *)iterExpr);
      constraints = (Constraint *)pvVar5->iterExpr;
      if ((Expression *)constraints != (Expression *)0x0) {
        Expression::visit<slang::ast::ExpressionVarVisitor&>
                  ((Expression *)constraints,(ExpressionVarVisitor *)extra);
      }
    }
    else {
      pcVar4 = std::
               variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
               ::index((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                        *)iterExpr,&visitor->anyVars,__c_00);
      if (pcVar4 == (char *)0x2) {
        pvVar6 = std::
                 get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                           ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                             *)iterExpr);
        __range3 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                   pvVar6->inlineConstraints;
        if (__range3 != (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x0) {
          Constraint::visit<slang::ast::ExpressionVarVisitor>
                    ((Constraint *)__range3,(ExpressionVarVisitor *)extra);
        }
      }
    }
  }
  ___begin3 = arguments(this);
  local_38 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)&__begin3;
  __end3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(local_38);
  ppEVar7 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(local_38);
  for (; __end3 != ppEVar7; __end3 = __end3 + 1) {
    Expression::visit<slang::ast::ExpressionVarVisitor&>(*__end3,(ExpressionVarVisitor *)extra);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (thisClass())
            thisClass()->visit(visitor);

        if (isSystemCall()) {
            auto& extra = std::get<1>(subroutine).extraInfo;
            if (extra.index() == 1) {
                if (auto iterExpr = std::get<1>(extra).iterExpr)
                    iterExpr->visit(visitor);
            }
            else if (extra.index() == 2) {
                if (auto constraints = std::get<2>(extra).inlineConstraints)
                    constraints->visit(visitor);
            }
        }

        for (auto arg : arguments())
            arg->visit(visitor);
    }